

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

bool __thiscall V4L2Device::check_capabilities(V4L2Device *this)

{
  int iVar1;
  int *piVar2;
  int *in_RDI;
  v4l2_capability cap;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffddc;
  DispatchAction in_stack_fffffffffffffdde;
  Writer *in_stack_fffffffffffffde0;
  Writer *pWVar4;
  LineNumber in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  Level level;
  Writer *in_stack_fffffffffffffe00;
  VerboseLevel in_stack_fffffffffffffe10;
  Writer local_1e0;
  Writer local_170;
  char *local_100;
  undefined1 local_78 [84];
  uint local_24;
  bool local_1;
  
  level = (Level)((ulong)in_stack_fffffffffffffdf8 >> 0x30);
  memset(local_78,0,0x68);
  iVar1 = ioctl(*in_RDI,0x80685600,local_78);
  if (iVar1 < 0) {
    uVar3 = 0;
    el::base::Writer::Writer
              (in_stack_fffffffffffffe00,level,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdde,in_stack_fffffffffffffe10
              );
    el::base::Writer::construct
              ((Writer *)&stack0xffffffffffffff18,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [25])
               CONCAT26(in_stack_fffffffffffffdde,CONCAT24(in_stack_fffffffffffffddc,uVar3)));
    piVar2 = __errno_location();
    local_100 = strerror(*piVar2);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffde0,
               (char **)CONCAT26(in_stack_fffffffffffffdde,CONCAT24(in_stack_fffffffffffffddc,uVar3)
                                ));
    el::base::Writer::~Writer(in_stack_fffffffffffffde0);
    local_1 = false;
  }
  else if ((local_24 & 1) == 0) {
    uVar3 = 0;
    pWVar4 = &local_170;
    el::base::Writer::Writer
              (in_stack_fffffffffffffe00,level,(char *)pWVar4,in_stack_fffffffffffffde8,
               (char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdde,in_stack_fffffffffffffe10
              );
    el::base::Writer::construct(pWVar4,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [55])
               CONCAT26(in_stack_fffffffffffffdde,CONCAT24(in_stack_fffffffffffffddc,uVar3)));
    el::base::Writer::~Writer(in_stack_fffffffffffffde0);
    local_1 = false;
  }
  else if ((local_24 & 0x4000000) == 0) {
    uVar3 = 0;
    pWVar4 = &local_1e0;
    el::base::Writer::Writer
              (in_stack_fffffffffffffe00,level,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (char *)pWVar4,in_stack_fffffffffffffdde,in_stack_fffffffffffffe10);
    el::base::Writer::construct(pWVar4,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (pWVar4,(char (*) [43])
                      CONCAT26(in_stack_fffffffffffffdde,CONCAT24(in_stack_fffffffffffffddc,uVar3)))
    ;
    el::base::Writer::~Writer(pWVar4);
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
    check_capabilities()
    {
        struct v4l2_capability cap;
        std::memset(&cap, 0, sizeof(cap));

        if (ioctl(fd, VIDIOC_QUERYCAP, &cap) < 0) {
            LOG(ERROR) << "VIDIOC_QUERYCAP failed: " << strerror(errno);
            return false;
        }

        if ((cap.capabilities & V4L2_CAP_VIDEO_CAPTURE) == 0) {
            LOG(ERROR) << "The device does not handle single-planar video capture";
            return false;
        }

        if ((cap.capabilities & V4L2_CAP_STREAMING) == 0) {
            LOG(ERROR) << "The device does not handle frame streaming";
            return false;
        }

        return true;
    }